

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Vertex * __thiscall Graph::greedyCapacitorAllocation(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  double dVar3;
  Edge *pEVar4;
  Edge *pEVar5;
  double dVar6;
  
  do {
    pVVar1 = this->verticesList;
    if (pVVar1 == (Vertex *)0x0) {
      return pVVar1;
    }
    pEVar4 = pVVar1->edgesList;
    pEVar2 = pEVar4;
    dVar3 = pEVar4->reactivePowerFlow;
    while (dVar6 = dVar3, pEVar5 = pEVar2, pEVar4 = pEVar4->nextEdge, pEVar4 != (Edge *)0x0) {
      pEVar2 = pEVar4;
      dVar3 = pEVar4->reactivePowerFlow;
      if (pEVar4->reactivePowerFlow <= dVar6) {
        pEVar2 = pEVar5;
        dVar3 = dVar6;
      }
    }
    this = (Graph *)&pEVar5->destiny;
  } while (1e-07 <= ABS(dVar6));
  return pVVar1;
}

Assistant:

Vertex *Graph::greedyCapacitorAllocation(){
    double tol = 1e-7;
    Vertex *vertex = this->verticesList;
    while(vertex != NULL){
//        cout << endl << " Origin  Vertex #" << vertex->getID() << endl << " Destinations |";
        Edge *edgeChoice = vertex->getEdgesList();
        double criteria = edgeChoice->getReactivePowerFlow();
//        cout << " Vertex #" << edgeChoice->getDestiny()->getID() << ": " << edgeChoice->getReactivePowerFlow() << "\t|";
        for( Edge *e = edgeChoice->getNext(); e != NULL; e = e->getNext()) {
//            cout << " Vertex #" << e->getDestiny()->getID() << ": " << e->getReactivePowerFlow() << "\t|";
            if( (criteria) < (e->getReactivePowerFlow()) ){
                edgeChoice = e;
                criteria = edgeChoice->getReactivePowerFlow();
            }

        }
//        cout << endl << " BEST #" << edgeChoice->getDestiny()->getID() << ":    " << edgeChoice->getReactivePowerFlow() << endl;
        if( fabs(criteria) < tol) break;
        vertex = edgeChoice->getDestiny();
    }
//    cout <<  "              ALLOCATION VERTEX #" << vertex->getID() << endl;
    return vertex;
}